

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O0

void ExchCXX::detail::host_eval_exc_vxc_helper_unpolar<ExchCXX::BuiltinM062X_X>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  double *in_RCX;
  double in_RDX;
  double in_RSI;
  int in_EDI;
  double *in_R8;
  double *in_R9;
  double vl;
  double lapl_i;
  int32_t i;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar1;
  undefined4 in_stack_fffffffffffffff8;
  
  for (iVar1 = 0; iVar1 < in_EDI; iVar1 = iVar1 + 1) {
    mgga_screening_interface<ExchCXX::BuiltinM062X_X>::eval_exc_vxc_unpolar
              (vl,(double)CONCAT44(in_EDI,in_stack_fffffffffffffff8),in_RSI,in_RDX,in_RCX,in_R8,
               in_R9,(double *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),(double *)0x0);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_GENERATOR( host_eval_exc_vxc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const auto lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    double vl;
    traits::eval_exc_vxc_unpolar( rho[i], sigma[i], lapl_i, tau[i],
      eps[i], vrho[i], vsigma[i], vl, vtau[i] );
    if(traits::needs_laplacian) vlapl[i] = vl;

  }

}